

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdeadlinetimer.cpp
# Opt level: O2

qint64 __thiscall QDeadlineTimer::rawRemainingTimeNSecs(QDeadlineTimer *this)

{
  qint64 qVar1;
  QDeadlineTimer QVar2;
  
  QVar2 = current((uint)(byte)this->type);
  qVar1 = -1;
  if (!SBORROW8(this->t1,QVar2.t1)) {
    qVar1 = this->t1 - QVar2.t1;
  }
  return qVar1;
}

Assistant:

qint64 QDeadlineTimer::rawRemainingTimeNSecs() const noexcept
{
    if (t1 == std::numeric_limits<qint64>::min())
        return t1;          // we'd saturate to this anyway

    QDeadlineTimer now = current(timerType());
    qint64 r;
    if (qSubOverflow(t1, now.t1, &r))
        return -1;      // any negative number is fine
    return r;
}